

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O0

void __thiscall
duckdb::TupleDataCollection::AppendUnified
          (TupleDataCollection *this,TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,
          DataChunk *new_chunk,SelectionVector *append_sel,idx_t append_count)

{
  bool bVar1;
  TupleDataChunkState *in_RCX;
  TupleDataPinState *in_RDX;
  TupleDataCollection *in_RSI;
  DataChunk *in_RDI;
  idx_t in_R8;
  idx_t in_R9;
  TupleDataChunkState *unaff_retaddr;
  idx_t actual_append_count;
  idx_t local_48;
  DataChunk *new_chunk_00;
  
  local_48 = in_R9;
  new_chunk_00 = in_RDI;
  if (in_R9 == 0xffffffffffffffff) {
    local_48 = DataChunk::size((DataChunk *)in_RCX);
  }
  if (local_48 != 0) {
    bVar1 = TupleDataLayout::AllConstant
                      ((TupleDataLayout *)
                       (in_RDI->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      ComputeHeapSizes(unaff_retaddr,new_chunk_00,(SelectionVector *)in_RSI,(idx_t)in_RDX);
    }
    Build(in_RSI,in_RDX,in_RCX,in_R8,in_R9);
    Scatter(this,(TupleDataChunkState *)pin_state,(DataChunk *)chunk_state,
            (SelectionVector *)new_chunk,(idx_t)append_sel);
  }
  return;
}

Assistant:

void TupleDataCollection::AppendUnified(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                        DataChunk &new_chunk, const SelectionVector &append_sel,
                                        const idx_t append_count) {
	const idx_t actual_append_count = append_count == DConstants::INVALID_INDEX ? new_chunk.size() : append_count;
	if (actual_append_count == 0) {
		return;
	}

	if (!layout.AllConstant()) {
		TupleDataCollection::ComputeHeapSizes(chunk_state, new_chunk, append_sel, actual_append_count);
	}

	Build(pin_state, chunk_state, 0, actual_append_count);
	Scatter(chunk_state, new_chunk, append_sel, actual_append_count);
}